

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineInterface.cpp
# Opt level: O1

void __thiscall
supermap::cli::CommandLineInterface::CommandLineInterface(CommandLineInterface *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined1 local_79;
  HelpHandler *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  string local_68;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_48;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> local_38;
  
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (this->handlers_)._M_h._M_buckets = &(this->handlers_)._M_h._M_single_bucket;
  (this->handlers_)._M_h._M_bucket_count = 1;
  (this->handlers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->handlers_)._M_h._M_element_count = 0;
  (this->handlers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->handlers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->handlers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->running_ = false;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"help","");
  local_78 = (HelpHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::cli::CommandLineInterface::HelpHandler,std::allocator<supermap::cli::CommandLineInterface::HelpHandler>,supermap::cli::CommandLineInterface&>
            (&_Stack_70,&local_78,
             (allocator<supermap::cli::CommandLineInterface::HelpHandler> *)&local_79,this);
  local_38.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &local_78->super_Handler;
  local_38.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_70._M_pi;
  local_78 = (HelpHandler *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCommand(this,&local_68,&local_38);
  if (local_38.
      super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"stop","");
  local_78 = (HelpHandler *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<supermap::cli::CommandLineInterface::StopHandler,std::allocator<supermap::cli::CommandLineInterface::StopHandler>,supermap::cli::CommandLineInterface&>
            (&_Stack_70,(StopHandler **)&local_78,
             (allocator<supermap::cli::CommandLineInterface::StopHandler> *)&local_79,this);
  local_48.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &local_78->super_Handler;
  local_48.
  super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_70._M_pi;
  local_78 = (HelpHandler *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addCommand(this,&local_68,&local_48);
  if (local_48.
      super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<supermap::cli::CommandLineInterface::Handler,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CommandLineInterface::CommandLineInterface(std::string name)
    : name_(std::move(name)) {
    addCommand("help", std::make_shared<HelpHandler>(*this));
    addCommand("stop", std::make_shared<StopHandler>(*this));
}